

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O0

int Abc_NtkDetectObjClasses_rec
              (Abc_Obj_t *pObj,Vec_Int_t *vMap,Hsh_VecMan_t *pHash,Vec_Int_t *vTemp)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Abc_Obj_t *pAVar6;
  Vec_Int_t *p;
  Vec_Int_t *pVVar7;
  Vec_Int_t t;
  int Entry;
  int i;
  Abc_Obj_t *pNext;
  Vec_Int_t *vSet;
  Vec_Int_t *vArray;
  Vec_Int_t *vTemp_local;
  Hsh_VecMan_t *pHash_local;
  Vec_Int_t *vMap_local;
  Abc_Obj_t *pObj_local;
  
  uVar4 = Abc_ObjId(pObj);
  pObj_local._4_4_ = Vec_IntEntry(vMap,uVar4);
  if (pObj_local._4_4_ == -1) {
    iVar5 = Abc_ObjIsCi(pObj);
    if ((iVar5 == 0) && (iVar5 = Abc_ObjIsNode(pObj), iVar5 == 0)) {
      __assert_fail("Abc_ObjIsCi(pObj) || Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDetect.c"
                    ,0x164,
                    "int Abc_NtkDetectObjClasses_rec(Abc_Obj_t *, Vec_Int_t *, Hsh_VecMan_t *, Vec_Int_t *)"
                   );
    }
    iVar5 = Abc_ObjFanoutNum(pObj);
    if (iVar5 == 0) {
      uVar4 = Abc_ObjId(pObj);
      Vec_IntWriteEntry(vMap,uVar4,0);
      pObj_local._4_4_ = 0;
    }
    else {
      pAVar6 = Abc_ObjFanout0(pObj);
      pObj_local._4_4_ = Abc_NtkDetectObjClasses_rec(pAVar6,vMap,pHash,vTemp);
      iVar5 = Abc_ObjFanoutNum(pObj);
      if (iVar5 == 1) {
        uVar4 = Abc_ObjId(pObj);
        Vec_IntWriteEntry(vMap,uVar4,pObj_local._4_4_);
      }
      else {
        p = Vec_IntAlloc(0x10);
        pVVar7 = Hsh_VecReadEntry(pHash,pObj_local._4_4_);
        Vec_IntClear(p);
        Vec_IntAppend(p,pVVar7);
        for (t.pArray._4_4_ = 0; iVar5 = Abc_ObjFanoutNum(pObj), t.pArray._4_4_ < iVar5;
            t.pArray._4_4_ = t.pArray._4_4_ + 1) {
          pAVar6 = Abc_ObjFanout(pObj,t.pArray._4_4_);
          if (t.pArray._4_4_ != 0) {
            iVar5 = Abc_NtkDetectObjClasses_rec(pAVar6,vMap,pHash,vTemp);
            pVVar7 = Hsh_VecReadEntry(pHash,iVar5);
            Vec_IntTwoMerge2(p,pVVar7,vTemp);
            iVar2 = p->nCap;
            iVar3 = p->nSize;
            piVar1 = p->pArray;
            iVar5 = vTemp->nSize;
            p->nCap = vTemp->nCap;
            p->nSize = iVar5;
            p->pArray = vTemp->pArray;
            vTemp->nCap = iVar2;
            vTemp->nSize = iVar3;
            vTemp->pArray = piVar1;
          }
        }
        pObj_local._4_4_ = Hsh_VecManAdd(pHash,p);
        uVar4 = Abc_ObjId(pObj);
        Vec_IntWriteEntry(vMap,uVar4,pObj_local._4_4_);
        Vec_IntFree(p);
      }
    }
  }
  return pObj_local._4_4_;
}

Assistant:

int Abc_NtkDetectObjClasses_rec( Abc_Obj_t * pObj, Vec_Int_t * vMap, Hsh_VecMan_t * pHash, Vec_Int_t * vTemp )
{
    Vec_Int_t * vArray, * vSet;
    Abc_Obj_t * pNext; int i;
    // get the CO set for this object
    int Entry = Vec_IntEntry(vMap, Abc_ObjId(pObj));
    if ( Entry != -1 ) // the set is already computed
        return Entry;
    // compute a new CO set
    assert( Abc_ObjIsCi(pObj) || Abc_ObjIsNode(pObj) );
    // if there is no fanouts, the set of COs is empty
    if ( Abc_ObjFanoutNum(pObj) == 0 )
    {
        Vec_IntWriteEntry( vMap, Abc_ObjId(pObj), 0 );
        return 0;
    }
    // compute the set for the first fanout
    Entry = Abc_NtkDetectObjClasses_rec( Abc_ObjFanout0(pObj), vMap, pHash, vTemp );
    if ( Abc_ObjFanoutNum(pObj) == 1 )
    {
        Vec_IntWriteEntry( vMap, Abc_ObjId(pObj), Entry );
        return Entry;
    }
    vSet = Vec_IntAlloc( 16 );
    // initialize the set with that of first fanout
    vArray = Hsh_VecReadEntry( pHash, Entry );
    Vec_IntClear( vSet );
    Vec_IntAppend( vSet, vArray );
    // iteratively add sets of other fanouts
    Abc_ObjForEachFanout( pObj, pNext, i )
    {
        if ( i == 0 ) 
            continue;
        Entry = Abc_NtkDetectObjClasses_rec( pNext, vMap, pHash, vTemp );
        vArray = Hsh_VecReadEntry( pHash, Entry );
        Vec_IntTwoMerge2( vSet, vArray, vTemp );
        ABC_SWAP( Vec_Int_t, *vSet, *vTemp );
    }
    // create or find new set and map the object into it
    Entry = Hsh_VecManAdd( pHash, vSet );
    Vec_IntWriteEntry( vMap, Abc_ObjId(pObj), Entry );
    Vec_IntFree( vSet );
    return Entry;
}